

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_exchange_declare.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  int iVar4;
  int x_04;
  undefined8 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 local_d0 [4];
  undefined8 local_b0 [4];
  undefined8 local_90 [4];
  undefined8 local_70 [4];
  undefined8 local_50 [4];
  
  if (argc < 5) {
    main_cold_1();
    iVar4 = 1;
  }
  else {
    pcVar1 = argv[1];
    iVar4 = atoi(argv[2]);
    pcVar2 = argv[3];
    pcVar3 = argv[4];
    uVar5 = amqp_new_connection();
    lVar6 = amqp_tcp_socket_new(uVar5);
    if (lVar6 == 0) {
      die("creating TCP socket");
    }
    iVar4 = amqp_socket_open(lVar6,pcVar1,iVar4);
    if (iVar4 != 0) {
      die("opening TCP socket");
    }
    iVar4 = 0;
    amqp_login(local_50,uVar5,"/",0,0x20000,0,0,0x10206b,0x10206b);
    x.reply.id = (int)local_50[1];
    x._0_8_ = local_50[0];
    x.reply._4_4_ = (int)((ulong)local_50[1] >> 0x20);
    x.reply.decoded._0_4_ = (int)local_50[2];
    x.reply.decoded._4_4_ = (int)((ulong)local_50[2] >> 0x20);
    x.library_error = (int)local_50[3];
    x._28_4_ = (int)((ulong)local_50[3] >> 0x20);
    die_on_amqp_error(x,"Logging in");
    amqp_channel_open(uVar5,1);
    amqp_get_rpc_reply(local_70,uVar5);
    x_00.reply.id = (int)local_70[1];
    x_00._0_8_ = local_70[0];
    x_00.reply._4_4_ = (int)((ulong)local_70[1] >> 0x20);
    x_00.reply.decoded._0_4_ = (int)local_70[2];
    x_00.reply.decoded._4_4_ = (int)((ulong)local_70[2] >> 0x20);
    x_00.library_error = (int)local_70[3];
    x_00._28_4_ = (int)((ulong)local_70[3] >> 0x20);
    die_on_amqp_error(x_00,"Opening channel");
    auVar7 = amqp_cstring_bytes(pcVar2);
    auVar8 = amqp_cstring_bytes(pcVar3);
    amqp_exchange_declare
              (uVar5,1,auVar7._0_8_,auVar7._8_8_,auVar8._0_8_,auVar8._8_8_,0,0,0,0,_amqp_empty_table
               ,_putchar);
    amqp_get_rpc_reply(local_90,uVar5);
    x_01.reply.id = (int)local_90[1];
    x_01._0_8_ = local_90[0];
    x_01.reply._4_4_ = (int)((ulong)local_90[1] >> 0x20);
    x_01.reply.decoded._0_4_ = (int)local_90[2];
    x_01.reply.decoded._4_4_ = (int)((ulong)local_90[2] >> 0x20);
    x_01.library_error = (int)local_90[3];
    x_01._28_4_ = (int)((ulong)local_90[3] >> 0x20);
    die_on_amqp_error(x_01,"Declaring exchange");
    amqp_channel_close(local_b0,uVar5,1,200);
    x_02.reply.id = (int)local_b0[1];
    x_02._0_8_ = local_b0[0];
    x_02.reply._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
    x_02.reply.decoded._0_4_ = (int)local_b0[2];
    x_02.reply.decoded._4_4_ = (int)((ulong)local_b0[2] >> 0x20);
    x_02.library_error = (int)local_b0[3];
    x_02._28_4_ = (int)((ulong)local_b0[3] >> 0x20);
    die_on_amqp_error(x_02,"Closing channel");
    amqp_connection_close(local_d0,uVar5,200);
    x_03.reply.id = (int)local_d0[1];
    x_03._0_8_ = local_d0[0];
    x_03.reply._4_4_ = (int)((ulong)local_d0[1] >> 0x20);
    x_03.reply.decoded._0_4_ = (int)local_d0[2];
    x_03.reply.decoded._4_4_ = (int)((ulong)local_d0[2] >> 0x20);
    x_03.library_error = (int)local_d0[3];
    x_03._28_4_ = (int)((ulong)local_d0[3] >> 0x20);
    die_on_amqp_error(x_03,"Closing connection");
    x_04 = amqp_destroy_connection(uVar5);
    die_on_error(x_04,"Ending connection");
  }
  return iVar4;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *exchangetype;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;

  if (argc < 5) {
    fprintf(stderr, "Usage: amqp_exchange_declare host port exchange exchangetype\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  exchangetype = argv[4];

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  amqp_exchange_declare(conn, 1, amqp_cstring_bytes(exchange), amqp_cstring_bytes(exchangetype),
                        0, 0, 0, 0, amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring exchange");

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");
  return 0;
}